

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O3

void __thiscall soul::Structure::addMember(Structure *this,Type *type,string *memberName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 uVar3;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  mapped_type mVar4;
  undefined4 uVar12;
  undefined8 uVar5;
  bool bVar13;
  mapped_type *pmVar14;
  string_view memberName_00;
  Member local_70;
  Structure *local_30;
  undefined7 uVar7;
  undefined6 uVar9;
  undefined5 uVar11;
  
  memberName_00._M_str = (memberName->_M_dataplus)._M_p;
  memberName_00._M_len = memberName->_M_string_length;
  bVar13 = hasMemberWithName(this,memberName_00);
  if (bVar13) {
    throwInternalCompilerError("! hasMemberWithName (memberName)","addMember",0x2a);
  }
  if (type->category == structure) {
    Type::getStruct((Type *)&local_30);
    if (local_30 == (Structure *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x47);
    }
    local_70.type.category = structure;
    local_70.type.arrayElementCategory = invalid;
    local_70.type.isRef = false;
    local_70.type.isConstant = false;
    local_70.type.primitiveType.type = invalid;
    local_70.type.boundingSize._0_1_ = 0;
    local_70.type._9_7_ = 0;
    (this->super_RefCountedObject).refCount = (this->super_RefCountedObject).refCount + 1;
    local_70.type.structure.object = this;
    bVar13 = containsMemberOfType(local_30,&local_70.type,true);
    if (bVar13) {
      throwInternalCompilerError
                ("! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true))"
                 ,"addMember",0x2d);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(this);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_30);
  }
  mVar4 = (this->members).numActive;
  pmVar14 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->memberIndexMap,memberName);
  *pmVar14 = mVar4;
  uVar3 = type->category;
  uVar6 = type->arrayElementCategory;
  uVar8 = type->isRef;
  uVar10 = type->isConstant;
  uVar12 = type->primitiveType;
  uVar11 = CONCAT41(uVar12,uVar10);
  uVar9 = CONCAT51(uVar11,uVar8);
  uVar7 = CONCAT61(uVar9,uVar6);
  paVar2 = &local_70.name.field_2;
  uVar5._0_4_ = type->boundingSize;
  uVar5._4_4_ = type->arrayElementBoundingSize;
  local_70.type.boundingSize._0_1_ = (undefined1)(undefined4)uVar5;
  local_70.type._9_7_ = SUB87((ulong)uVar5 >> 8,0);
  local_70.type.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  local_70.name._M_dataplus._M_p = (memberName->_M_dataplus)._M_p;
  paVar1 = &memberName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p == paVar1) {
    local_70.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.name.field_2._8_8_ = *(undefined8 *)((long)&memberName->field_2 + 8);
    local_70.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_70.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_70.name._M_string_length = memberName->_M_string_length;
  (memberName->_M_dataplus)._M_p = (pointer)paVar1;
  memberName->_M_string_length = 0;
  (memberName->field_2)._M_local_buf[0] = '\0';
  local_70.readWriteCount.numReads = 0;
  local_70.readWriteCount.numWrites = 0;
  local_70.type.category = uVar3;
  local_70.type._1_7_ = uVar7;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::push_back(&this->members,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.name._M_dataplus._M_p,local_70.name.field_2._M_allocated_capacity + 1);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_70.type.structure.object);
  return;
}

Assistant:

void Structure::addMember (Type type, std::string memberName)
{
    SOUL_ASSERT (! hasMemberWithName (memberName));

    // Ensure we won't create a recursive structure (one containing itself) if we add a member of this type
    SOUL_ASSERT (! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true)));

    memberIndexMap[memberName] = members.size();
    members.push_back ({ std::move (type), std::move (memberName) });

}